

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reoCore.c
# Opt level: O3

void reoReorderArray(reo_man *p,DdManager *dd,DdNode **Funcs,DdNode **FuncsRes,int nFuncs,
                    int *pOrder)

{
  double dVar1;
  double dVar2;
  int *piVar3;
  int *piVar4;
  int *piVar5;
  ulong uVar6;
  int iVar7;
  int *piVar8;
  reo_unit *prVar9;
  DdNode *pDVar10;
  ulong uVar11;
  ulong uVar12;
  long lVar13;
  int iVar14;
  long lVar15;
  bool bVar16;
  
  uVar6 = (ulong)(uint)nFuncs;
  p->dd = dd;
  p->pOrder = pOrder;
  p->nTops = nFuncs;
  iVar7 = Cudd_SharingSize(Funcs,nFuncs);
  p->nNodesBeg = iVar7;
  iVar14 = dd->size;
  if (dd->size < dd->sizeZ) {
    iVar14 = dd->sizeZ;
  }
  reoResizeStructures(p,iVar14,iVar7,nFuncs);
  piVar8 = Extra_VectorSupportArray(dd,Funcs,nFuncs,p->pSupp);
  p->pSupp = piVar8;
  p->nSupp = 0;
  iVar14 = dd->size;
  uVar11 = (ulong)iVar14;
  if ((long)uVar11 < 1) {
LAB_0081c8a6:
    if (0 < nFuncs) {
      uVar11 = 0;
      do {
        pDVar10 = Funcs[uVar11];
        FuncsRes[uVar11] = pDVar10;
        Cudd_Ref(pDVar10);
        uVar11 = uVar11 + 1;
      } while (uVar6 != uVar11);
    }
    return;
  }
  uVar12 = 0;
  iVar7 = 0;
  do {
    iVar7 = iVar7 + piVar8[uVar12];
    p->nSupp = iVar7;
    uVar12 = uVar12 + 1;
  } while (uVar11 != uVar12);
  if (iVar7 == 0) goto LAB_0081c8a6;
  if (0 < iVar14) {
    piVar3 = dd->invperm;
    lVar13 = 0;
    iVar14 = 0;
    do {
      if (piVar8[piVar3[lVar13]] != 0) {
        p->pMapToPlanes[piVar3[lVar13]] = iVar14;
        iVar7 = piVar3[lVar13];
        p->pMapToDdVarsOrig[iVar14] = iVar7;
        if (p->fRemapUp != 0) {
          iVar7 = piVar3[iVar14];
        }
        p->pMapToDdVarsFinal[iVar14] = iVar7;
        p->pOrderInt[iVar14] = iVar14;
        iVar14 = iVar14 + 1;
        uVar11 = (ulong)(uint)dd->size;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < (int)uVar11);
  }
  iVar14 = 0;
  p->nUnitsUsed = 0;
  p->nNodesCur = 0;
  p->fThisIsAdd = 0;
  p->Signature = p->Signature + 1;
  if (0 < nFuncs) {
    uVar11 = 0;
    do {
      prVar9 = reoTransferNodesToUnits_rec(p,Funcs[uVar11]);
      p->pTops[uVar11] = prVar9;
      uVar11 = uVar11 + 1;
    } while (uVar6 != uVar11);
    iVar14 = p->nNodesCur;
  }
  if (p->nNodesBeg != iVar14) {
    __assert_fail("p->nNodesBeg == p->nNodesCur",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/reo/reoCore.c"
                  ,0x67,
                  "void reoReorderArray(reo_man *, DdManager *, DdNode **, DdNode **, int, int *)");
  }
  if (p->fThisIsAdd == 0) {
    if (p->fMinWidth != 0) {
      puts("An important message from the REO reordering engine:");
      puts("The BDD given to the engine for reordering contains complemented edges.");
      puts("Currently, such BDDs cannot be reordered for the minimum width.");
      puts("Therefore, minimization for the number of BDD nodes is performed.");
      fflush(_stdout);
    }
LAB_0081c918:
    if (p->fMinApl == 0) {
      reoProfileNodesStart(p);
    }
    else {
      reoProfileAplStart(p);
    }
  }
  else {
    if (p->fMinWidth == 0) goto LAB_0081c918;
    reoProfileWidthStart(p);
  }
  if (p->fVerbose != 0) {
    puts("INITIAL:");
    if (p->fMinWidth == 0) {
      if (p->fMinApl == 0) {
        reoProfileNodesPrint(p);
      }
      else {
        reoProfileAplPrint(p);
      }
    }
    else {
      reoProfileWidthPrint(p);
    }
  }
  p->nSwaps = 0;
  p->nNISwaps = 0;
  if (0 < p->nIters) {
    iVar14 = 0;
    do {
      reoReorderSift(p);
      if (p->fVerbose != 0) {
        printf("ITER #%d:\n");
        if (p->fMinWidth == 0) {
          if (p->fMinApl == 0) {
            reoProfileNodesPrint(p);
          }
          else {
            reoProfileAplPrint(p);
          }
        }
        else {
          reoProfileWidthPrint(p);
        }
      }
      if (p->fMinWidth == 0) {
        if (p->fMinApl == 0) {
          iVar7 = p->nNodesCur;
          p->nNodesEnd = iVar7;
          bVar16 = iVar7 == p->nNodesBeg;
          if (p->nNodesBeg < iVar7) {
            __assert_fail("p->nNodesEnd <= p->nNodesBeg",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/reo/reoCore.c"
                          ,0xaa,
                          "void reoReorderArray(reo_man *, DdManager *, DdNode **, DdNode **, int, int *)"
                         );
          }
          goto LAB_0081c9e6;
        }
        dVar1 = p->nAplCur;
        dVar2 = p->nAplBeg;
        p->nAplEnd = dVar1;
        if (dVar2 < dVar1) {
          __assert_fail("p->nAplEnd <= p->nAplBeg",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/reo/reoCore.c"
                        ,0xa3,
                        "void reoReorderArray(reo_man *, DdManager *, DdNode **, DdNode **, int, int *)"
                       );
        }
        if ((dVar1 == dVar2) && (!NAN(dVar1) && !NAN(dVar2))) break;
      }
      else {
        iVar7 = p->nWidthCur;
        p->nWidthEnd = iVar7;
        bVar16 = iVar7 == p->nWidthBeg;
        if (!bVar16 && p->nWidthBeg <= iVar7) {
          __assert_fail("p->nWidthEnd <= p->nWidthBeg",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/reo/reoCore.c"
                        ,0x9c,
                        "void reoReorderArray(reo_man *, DdManager *, DdNode **, DdNode **, int, int *)"
                       );
        }
LAB_0081c9e6:
        if (bVar16) break;
      }
      iVar14 = iVar14 + 1;
    } while (iVar14 < p->nIters);
  }
  if (0 < (long)p->nSupp) {
    uVar11 = 0;
    do {
      if (p->pPlanes[uVar11].statsNodes == 0) {
        __assert_fail("p->pPlanes[i].statsNodes",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/reo/reoCore.c"
                      ,0x1aa,"int reoCheckLevels(reo_man *)");
      }
      for (prVar9 = p->pPlanes[uVar11].pHead; prVar9 != (reo_unit *)0x0; prVar9 = prVar9->Next) {
        if (uVar11 != (uint)(int)prVar9->lev) {
          __assert_fail("pUnit->lev == i",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/reo/reoCore.c"
                        ,0x1ae,"int reoCheckLevels(reo_man *)");
        }
      }
      uVar11 = uVar11 + 1;
    } while (uVar11 != (long)p->nSupp);
  }
  s_AplBefore = p->nAplBeg;
  s_AplAfter = p->nAplEnd;
  p->Signature = p->Signature + 1;
  p->nRefNodes = 0;
  p->nNodesCur = 0;
  if (0 < nFuncs) {
    uVar11 = 0;
    do {
      pDVar10 = reoTransferUnitsToNodes_rec(p,p->pTops[uVar11]);
      FuncsRes[uVar11] = pDVar10;
      Cudd_Ref(pDVar10);
      uVar11 = uVar11 + 1;
    } while (uVar6 != uVar11);
    if (0 < p->nRefNodes) {
      lVar13 = 0;
      do {
        Cudd_RecursiveDeref(dd,p->pRefNodes[lVar13]);
        lVar13 = lVar13 + 1;
      } while (lVar13 < p->nRefNodes);
    }
    if (0 < nFuncs) {
      uVar11 = 0;
      do {
        reoRecursiveDeref(p->pTops[uVar11]);
        uVar11 = uVar11 + 1;
      } while (uVar6 != uVar11);
    }
  }
  iVar14 = p->nSupp;
  lVar13 = (long)iVar14;
  for (prVar9 = p->pPlanes[lVar13].pHead; prVar9 != (reo_unit *)0x0; prVar9 = prVar9->Next) {
    if (prVar9->n != 0) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/reo/reoCore.c"
                    ,0x191,"int reoCheckZeroRefs(reo_plane *)");
    }
  }
  piVar8 = p->pOrder;
  if (piVar8 == (int *)0x0) {
    if (p->fVerify == 0) goto LAB_0081ccb7;
    piVar8 = (int *)malloc(lVar13 * 4);
    if (0 < iVar14) {
      piVar3 = p->pOrderInt;
      piVar4 = p->pMapToDdVarsOrig;
      piVar5 = p->pMapToDdVarsFinal;
      lVar15 = 0;
      do {
        piVar8[piVar5[lVar15]] = piVar4[piVar3[lVar15]];
        lVar15 = lVar15 + 1;
      } while (lVar13 != lVar15);
    }
  }
  else {
    if (0 < iVar14) {
      piVar3 = p->pOrderInt;
      piVar4 = p->pMapToDdVarsOrig;
      piVar5 = p->pMapToDdVarsFinal;
      lVar13 = 0;
      do {
        piVar8[piVar5[lVar13]] = piVar4[piVar3[lVar13]];
        lVar13 = lVar13 + 1;
      } while (lVar13 < p->nSupp);
    }
    if (p->fVerify == 0) goto LAB_0081ccb7;
  }
  if (0 < nFuncs) {
    uVar11 = 0;
    do {
      if (p->fThisIsAdd == 0) {
        pDVar10 = Cudd_bddPermute(dd,FuncsRes[uVar11],piVar8);
      }
      else {
        pDVar10 = Cudd_addPermute(dd,FuncsRes[uVar11],piVar8);
      }
      Cudd_Ref(pDVar10);
      if (pDVar10 != Funcs[uVar11]) {
        puts("REO: Internal verification has failed!");
        fflush(_stdout);
      }
      Cudd_RecursiveDeref(dd,pDVar10);
      uVar11 = uVar11 + 1;
    } while (uVar6 != uVar11);
  }
  puts("REO: Internal verification is okay!");
  if ((piVar8 != (int *)0x0) && (p->pOrder == (int *)0x0)) {
    free(piVar8);
  }
LAB_0081ccb7:
  if (p->nSupp < 0) {
    return;
  }
  lVar13 = -1;
  lVar15 = 0;
  do {
    reoUnitsRecycleUnitList(p,(reo_plane *)((long)&p->pPlanes->fSifted + lVar15));
    lVar13 = lVar13 + 1;
    lVar15 = lVar15 + 0x38;
  } while (lVar13 < p->nSupp);
  return;
}

Assistant:

void reoReorderArray( reo_man * p, DdManager * dd, DdNode * Funcs[], DdNode * FuncsRes[], int nFuncs, int * pOrder )
{
    int Counter, i;

    // set the initial parameters
    p->dd     = dd;
    p->pOrder = pOrder;
    p->nTops  = nFuncs;
    // get the initial number of nodes
    p->nNodesBeg = Cudd_SharingSize( Funcs, nFuncs );     
    // resize the internal data structures of the manager if necessary
    reoResizeStructures( p, ddMax(dd->size,dd->sizeZ), p->nNodesBeg, nFuncs );
    // compute the support
    p->pSupp = Extra_VectorSupportArray( dd, Funcs, nFuncs, p->pSupp );
    // get the number of support variables
    p->nSupp = 0;
    for ( i = 0; i < dd->size; i++ )
        p->nSupp += p->pSupp[i];

    // if it is the constant function, no need to reorder
    if ( p->nSupp == 0 )
    {
        for ( i = 0; i < nFuncs; i++ )
        {
            FuncsRes[i] = Funcs[i]; Cudd_Ref( FuncsRes[i] );
        }
        return;
    }

    // create the internal variable maps
    // go through variable levels in the manager
    Counter = 0;
    for ( i = 0; i < dd->size; i++ )
        if ( p->pSupp[ dd->invperm[i] ] )
        {
            p->pMapToPlanes[ dd->invperm[i] ] = Counter;
            p->pMapToDdVarsOrig[Counter]      = dd->invperm[i];
            if ( !p->fRemapUp )
                p->pMapToDdVarsFinal[Counter] = dd->invperm[i];
            else
                p->pMapToDdVarsFinal[Counter] = dd->invperm[Counter];
            p->pOrderInt[Counter]        = Counter;
            Counter++;
        }

    // set the initial parameters
    p->nUnitsUsed = 0;
    p->nNodesCur  = 0;
    p->fThisIsAdd = 0;
    p->Signature++;
    // transfer the function from the CUDD package into REO"s internal data structure
    for ( i = 0; i < nFuncs; i++ )
        p->pTops[i] = reoTransferNodesToUnits_rec( p, Funcs[i] );
    assert( p->nNodesBeg == p->nNodesCur );

    if ( !p->fThisIsAdd && p->fMinWidth )
    {
        printf( "An important message from the REO reordering engine:\n" );
        printf( "The BDD given to the engine for reordering contains complemented edges.\n" );
        printf( "Currently, such BDDs cannot be reordered for the minimum width.\n" );
        printf( "Therefore, minimization for the number of BDD nodes is performed.\n" );
        fflush( stdout );
        p->fMinApl   = 0;
        p->fMinWidth = 0;
    }

    if ( p->fMinWidth )
        reoProfileWidthStart(p);
    else if ( p->fMinApl )
        reoProfileAplStart(p);
    else 
        reoProfileNodesStart(p);

    if ( p->fVerbose )
    {
        printf( "INITIAL:\n" );
        if ( p->fMinWidth )
            reoProfileWidthPrint(p);
        else if ( p->fMinApl )
            reoProfileAplPrint(p);
        else
            reoProfileNodesPrint(p);
    }
 
    ///////////////////////////////////////////////////////////////////
    // performs the reordering
    p->nSwaps   = 0;
    p->nNISwaps = 0;
    for ( i = 0; i < p->nIters; i++ )
    {
        reoReorderSift( p );
        // print statistics after each iteration
        if ( p->fVerbose )
        {
            printf( "ITER #%d:\n", i+1 );
            if ( p->fMinWidth )
                reoProfileWidthPrint(p);
            else if ( p->fMinApl )
                reoProfileAplPrint(p);
            else
                reoProfileNodesPrint(p);
        }
        // if the cost function did not change, stop iterating
        if ( p->fMinWidth )
        {
            p->nWidthEnd = p->nWidthCur;
            assert( p->nWidthEnd <= p->nWidthBeg );
            if ( p->nWidthEnd == p->nWidthBeg )
                break;
        }
        else if ( p->fMinApl )
        {
            p->nAplEnd = p->nAplCur;
            assert( p->nAplEnd <= p->nAplBeg );
            if ( p->nAplEnd == p->nAplBeg )
                break;
        }
        else
        {
            p->nNodesEnd = p->nNodesCur;
            assert( p->nNodesEnd <= p->nNodesBeg );
            if ( p->nNodesEnd == p->nNodesBeg )
                break;
        }
    }
    assert( reoCheckLevels( p ) );
    ///////////////////////////////////////////////////////////////////

s_AplBefore = p->nAplBeg;
s_AplAfter  = p->nAplEnd;

    // set the initial parameters
    p->nRefNodes  = 0;
    p->nNodesCur  = 0;
    p->Signature++;
    // transfer the BDDs from REO's internal data structure to CUDD
    for ( i = 0; i < nFuncs; i++ )
    {
        FuncsRes[i] = reoTransferUnitsToNodes_rec( p, p->pTops[i] ); Cudd_Ref( FuncsRes[i] );
    }
    // undo the DDs referenced for storing in the cache
    for ( i = 0; i < p->nRefNodes; i++ )
        Cudd_RecursiveDeref( dd, p->pRefNodes[i] );
    // verify zero refs of the terminal nodes
    for ( i = 0; i < nFuncs; i++ )
    {
        assert( reoRecursiveDeref( p->pTops[i] ) );
    }
    assert( reoCheckZeroRefs( &(p->pPlanes[p->nSupp]) ) );

    // prepare the variable map to return to the user
    if ( p->pOrder )
    {
        // i is the current level in the planes data structure
        // p->pOrderInt[i] is the original level in the planes data structure
        // p->pMapToDdVarsOrig[i] is the variable, into which we remap when we construct the BDD from planes
        // p->pMapToDdVarsOrig[ p->pOrderInt[i] ] is the original BDD variable corresponding to this level
        // Therefore, p->pOrder[ p->pMapToDdVarsFinal[i] ] = p->pMapToDdVarsOrig[ p->pOrderInt[i] ]
        // creates the permutation, which remaps the resulting BDD variable into the original BDD variable
        for ( i = 0; i < p->nSupp; i++ )
            p->pOrder[ p->pMapToDdVarsFinal[i] ] = p->pMapToDdVarsOrig[ p->pOrderInt[i] ]; 
    }

    if ( p->fVerify )
    {
        int fVerification;
        DdNode * FuncRemapped;
        int * pOrder;

        if ( p->pOrder == NULL )
        {
            pOrder = ABC_ALLOC( int, p->nSupp );
            for ( i = 0; i < p->nSupp; i++ )
                pOrder[ p->pMapToDdVarsFinal[i] ] = p->pMapToDdVarsOrig[ p->pOrderInt[i] ]; 
        }
        else
            pOrder = p->pOrder;

        fVerification = 1;
        for ( i = 0; i < nFuncs; i++ )
        {
            // verify the result
            if ( p->fThisIsAdd )
                FuncRemapped = Cudd_addPermute( dd, FuncsRes[i], pOrder );
            else
                FuncRemapped = Cudd_bddPermute( dd, FuncsRes[i], pOrder );
            Cudd_Ref( FuncRemapped );

            if ( FuncRemapped != Funcs[i] )
            {
                fVerification = 0;
                printf( "REO: Internal verification has failed!\n" );
                fflush( stdout );
            }
            Cudd_RecursiveDeref( dd, FuncRemapped );
        }
        if ( fVerification )
            printf( "REO: Internal verification is okay!\n" );

        if ( p->pOrder == NULL )
            ABC_FREE( pOrder );
    }

    // recycle the data structure
    for ( i = 0; i <= p->nSupp; i++ )
        reoUnitsRecycleUnitList( p, p->pPlanes + i );
}